

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O3

int __thiscall MD5::MD5::init(MD5 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  ulong uVar2;
  void *pvVar3;
  uint uVar4;
  ulong in_RDX;
  uint uVar5;
  ulong __n;
  
  this->finished = false;
  uVar1 = this->count[0];
  uVar5 = uVar1 >> 3 & 0x3f;
  uVar2 = (ulong)uVar5;
  uVar4 = (int)in_RDX * 8;
  this->count[0] = uVar4 + uVar1;
  this->count[1] = this->count[1] + ((uint)(in_RDX >> 0x1d) & 7) + (uint)CARRY4(uVar4,uVar1);
  __n = 0x40 - uVar2;
  if (in_RDX < __n) {
    __n = 0;
  }
  else {
    memcpy(this->buffer + uVar2,ctx,__n);
    transform(this,this->buffer);
    if ((uVar5 ^ 0x7f) < in_RDX) {
      uVar1 = uVar5 ^ 0xbf;
      do {
        uVar4 = uVar1;
        transform(this,(byte *)(ctx + (uVar4 - 0x7f)));
        uVar1 = uVar4 + 0x40;
      } while (uVar4 < in_RDX);
      __n = (ulong)(uVar4 - 0x3f);
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
    }
  }
  pvVar3 = memcpy(this->buffer + uVar2,ctx + __n,in_RDX - __n);
  return (int)pvVar3;
}

Assistant:

void MD5::init(const byte* input, size_t len) {

  bit32 i, index, partLen;

  finished = false;

  /* Compute number of bytes mod 64 */
  index = (bit32)((count[0] >> 3) & 0x3f);

  /* update number of bits */
  if ((count[0] += ((bit32)len << 3)) < ((bit32)len << 3)) {
    ++count[1];
  }
  count[1] += ((bit32)len >> 29);

  partLen = 64 - index;

  /* transform as many times as possible. */
  if (len >= partLen) {

    memcpy(&buffer[index], input, partLen);
    transform(buffer);

    for (i = partLen; i + 63 < len; i += 64) {
      transform(&input[i]);
    }
    index = 0;

  } else {
    i = 0;
  }

  /* Buffer remaining input */
  memcpy(&buffer[index], &input[i], len - i);
}